

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt.c
# Opt level: O2

HCOSE_RECIPIENT COSE_Enveloped_GetRecipient(HCOSE_ENVELOPED cose,int iRecipient,cose_errback *perr)

{
  _Bool _Var1;
  HCOSE_RECIPIENT p_Var2;
  bool bVar3;
  
  _Var1 = IsValidEnvelopedHandle(cose);
  if (_Var1) {
    if (iRecipient < 0) {
LAB_0017eef8:
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
    }
    else {
      p_Var2 = (HCOSE_RECIPIENT)(cose + 0x68);
      while( true ) {
        p_Var2 = *(HCOSE_RECIPIENT *)p_Var2;
        bVar3 = iRecipient == 0;
        iRecipient = iRecipient + -1;
        if (bVar3) break;
        if (p_Var2 == (HCOSE_RECIPIENT)0x0) goto LAB_0017eef8;
        p_Var2 = p_Var2 + 0x70;
      }
      if (p_Var2 != (HCOSE_RECIPIENT)0x0) {
        *(int *)(p_Var2 + 0x10) = *(int *)(p_Var2 + 0x10) + 1;
        return p_Var2;
      }
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  return (HCOSE_RECIPIENT)0x0;
}

Assistant:

HCOSE_RECIPIENT COSE_Enveloped_GetRecipient(HCOSE_ENVELOPED cose, int iRecipient, cose_errback * perr)
{
	int i;
	COSE_RecipientInfo * p = NULL;

	CHECK_CONDITION(IsValidEnvelopedHandle(cose), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(iRecipient >= 0, COSE_ERR_INVALID_PARAMETER);

	p = ((COSE_Enveloped *)cose)->m_recipientFirst;
	for (i = 0; i < iRecipient; i++) {
		CHECK_CONDITION(p != NULL, COSE_ERR_INVALID_PARAMETER);
		p = p->m_recipientNext;
	}
	if (p != NULL) p->m_encrypt.m_message.m_refCount++;

errorReturn:
	return (HCOSE_RECIPIENT)p;
}